

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O2

double TasGrid::Optimizer::getValue<(TasGrid::TypeOneDRule)19>
                 (CurrentNodes<(TasGrid::TypeOneDRule)19> *current,double x)

{
  double dVar1;
  double *pdVar2;
  vector<double,_std::allocator<double>_> *__range2;
  OptimizerResult OVar3;
  CurrentNodes<(TasGrid::TypeOneDRule)20> companion;
  CurrentNodes<(TasGrid::TypeOneDRule)20> local_68;
  
  pdVar2 = (current->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (pdVar2 == (current->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      CurrentNodes<(TasGrid::TypeOneDRule)20>::CurrentNodes(&local_68,&current->nodes,x);
      OVar3 = computeMaximum<(TasGrid::TypeOneDRule)20>(&local_68);
      CurrentNodes<(TasGrid::TypeOneDRule)20>::~CurrentNodes(&local_68);
      return -OVar3.value;
    }
    dVar1 = *pdVar2;
    pdVar2 = pdVar2 + 1;
  } while (1e-11 <= ABS(x - dVar1));
  return -1e+100;
}

Assistant:

double getValue<rule_mindelta>(CurrentNodes<rule_mindelta> const& current, double x){
    for(auto n : current.nodes) if (std::abs(x - n) < 10 * Maths::num_tol) return -1.E+100;

    CurrentNodes<rule_mindeltaodd> companion(current.nodes, x);
    return - computeMaximum(companion).value;
}